

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhexview.cpp
# Opt level: O1

int __thiscall QHexView::visibleLines(QHexView *this,bool absolute)

{
  long lVar1;
  quint64 qVar2;
  int *piVar3;
  double dVar4;
  int vl;
  int local_24;
  double local_20;
  int local_14;
  
  lVar1 = QAbstractScrollArea::viewport();
  local_20 = (double)((*(int *)(*(long *)(lVar1 + 0x20) + 0x20) -
                      *(int *)(*(long *)(lVar1 + 0x20) + 0x18)) + 1);
  dVar4 = (double)QFontMetricsF::height();
  dVar4 = ceil(local_20 / dVar4);
  local_24 = (int)dVar4;
  if (((this->m_options).flags & 0x20) == 0) {
    local_24 = (int)dVar4 + -1;
  }
  if (absolute) {
    piVar3 = &local_24;
  }
  else {
    qVar2 = lines(this);
    local_14 = (int)qVar2;
    piVar3 = &local_24;
    if ((int)qVar2 < local_24) {
      piVar3 = &local_14;
    }
  }
  return *piVar3;
}

Assistant:

int QHexView::visibleLines(bool absolute) const {
    int vl = static_cast<int>(
        qCeil(this->viewport()->height() / this->lineHeight()));
    if(!m_options.hasFlag(QHexFlags::NoHeader))
        vl--;
    return absolute ? vl : qMin<int>(this->lines(), vl);
}